

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Disk.cpp
# Opt level: O1

void __thiscall Disk::format(Disk *this,Format *new_fmt,Data *data,bool cyls_first)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Encoding EVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  FdcType FVar12;
  DataRate DVar13;
  const_iterator itEnd;
  const_iterator it;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  pointer local_50;
  pointer local_48;
  Range local_40;
  
  local_48 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_50 = (data->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
  local_40 = Format::range(new_fmt);
  local_68 = (code *)0x0;
  pcStack_60 = (code *)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  local_78._M_unused._M_object = operator_new(0x20);
  *(Format **)local_78._M_unused._0_8_ = new_fmt;
  *(pointer **)((long)local_78._M_unused._0_8_ + 8) = &local_48;
  *(pointer **)((long)local_78._M_unused._0_8_ + 0x10) = &local_50;
  *(Disk **)((long)local_78._M_unused._0_8_ + 0x18) = this;
  pcStack_60 = std::
               _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Disk.cpp:144:26)>
               ::_M_invoke;
  local_68 = std::
             _Function_handler<void_(const_CylHead_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonowen[P]samdisk/src/Disk.cpp:144:26)>
             ::_M_manager;
  Range::each(&local_40,(function<void_(const_CylHead_&)> *)&local_78,cyls_first);
  if (local_68 != (code *)0x0) {
    (*local_68)(&local_78,&local_78,__destroy_functor);
  }
  iVar10 = new_fmt->cyls;
  iVar11 = new_fmt->heads;
  FVar12 = new_fmt->fdc;
  DVar13 = new_fmt->datarate;
  EVar6 = new_fmt->encoding;
  iVar7 = new_fmt->sectors;
  iVar8 = new_fmt->size;
  iVar9 = new_fmt->base;
  iVar2 = new_fmt->offset;
  iVar3 = new_fmt->interleave;
  iVar4 = new_fmt->skew;
  iVar5 = new_fmt->head0;
  uVar1 = *(undefined8 *)((long)&new_fmt->head1 + 2);
  *(undefined8 *)((long)&(this->fmt).skew + 2) = *(undefined8 *)((long)&new_fmt->skew + 2);
  *(undefined8 *)((long)&(this->fmt).head1 + 2) = uVar1;
  (this->fmt).offset = iVar2;
  (this->fmt).interleave = iVar3;
  (this->fmt).skew = iVar4;
  (this->fmt).head0 = iVar5;
  (this->fmt).encoding = EVar6;
  (this->fmt).sectors = iVar7;
  (this->fmt).size = iVar8;
  (this->fmt).base = iVar9;
  (this->fmt).cyls = iVar10;
  (this->fmt).heads = iVar11;
  (this->fmt).fdc = FVar12;
  (this->fmt).datarate = DVar13;
  return;
}

Assistant:

void Disk::format(const Format& new_fmt, const Data& data, bool cyls_first)
{
    auto it = data.begin(), itEnd = data.end();

    new_fmt.range().each([&](const CylHead& cylhead) {
        Track track;
        track.format(cylhead, new_fmt);
        it = track.populate(it, itEnd);
        write(cylhead, std::move(track));
        }, cyls_first);

    // Assign format after formatting as it's cleared by formatting
    fmt = new_fmt;
}